

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseDigit(State *state,int *digit)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = state->mangled_begin[(state->parse_state).mangled_idx];
  bVar2 = ParseCharClass(state,"0123456789");
  if (digit != (int *)0x0 && bVar2) {
    *digit = cVar1 + -0x30;
  }
  return bVar2;
}

Assistant:

static bool ParseDigit(State *state, int *digit) {
  char c = RemainingInput(state)[0];
  if (ParseCharClass(state, "0123456789")) {
    if (digit != nullptr) {
      *digit = c - '0';
    }
    return true;
  }
  return false;
}